

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeSetPreconditioner(void *cvode_mem,CVLsPrecSetupFn psetup,CVLsPrecSolveFn psolve)

{
  int iVar1;
  code *P_data;
  SUNPSetupFn Pset;
  void *in_RDX;
  SUNContext in_RSI;
  int retval;
  SUNPSolveFn cvls_psolve;
  SUNPSetupFn cvls_psetup;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  SUNLinearSolver in_stack_ffffffffffffffd0;
  CVodeMem local_28;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (CVLsMem *)0xefcaae);
  if (local_4 == 0) {
    in_stack_ffffffffffffffd0[8].sunctx = in_RSI;
    in_stack_ffffffffffffffd0[9].content = in_RDX;
    if (*(long *)(*(long *)((long)in_stack_ffffffffffffffd0[3].content + 8) + 0x18) == 0) {
      cvProcessError(local_28,-3,"CVLS","CVodeSetPreconditioner",
                     "SUNLinearSolver object does not support user-supplied preconditioning");
      local_4 = -3;
    }
    else {
      P_data = cvLsPSetup;
      if (in_RSI == (SUNContext)0x0) {
        P_data = (code *)0x0;
      }
      Pset = cvLsPSolve;
      if (in_RDX == (void *)0x0) {
        Pset = (SUNPSetupFn)0x0;
      }
      iVar1 = SUNLinSolSetPreconditioner
                        (in_stack_ffffffffffffffd0,P_data,Pset,
                         (SUNPSolveFn)(ulong)in_stack_ffffffffffffffb8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        cvProcessError(local_28,-9,"CVLS","CVLsSetPreconditioner",
                       "Error in calling SUNLinSolSetPreconditioner");
        local_4 = -9;
      }
    }
  }
  return local_4;
}

Assistant:

int CVodeSetPreconditioner(void *cvode_mem, CVLsPrecSetupFn psetup,
                           CVLsPrecSolveFn psolve)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  SUNPSetupFn cvls_psetup;
  SUNPSolveFn cvls_psolve;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeSetPreconditioner",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* store function pointers for user-supplied routines in CVLs interface */
  cvls_mem->pset   = psetup;
  cvls_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (cvls_mem->LS->ops->setpreconditioner == NULL) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetPreconditioner",
                   "SUNLinearSolver object does not support user-supplied preconditioning");
    return(CVLS_ILL_INPUT);
  }

  /* notify iterative linear solver to call CVLs interface routines */
  cvls_psetup = (psetup == NULL) ? NULL : cvLsPSetup;
  cvls_psolve = (psolve == NULL) ? NULL : cvLsPSolve;
  retval = SUNLinSolSetPreconditioner(cvls_mem->LS, cv_mem,
                                      cvls_psetup, cvls_psolve);
  if (retval != SUNLS_SUCCESS) {
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS",
                   "CVLsSetPreconditioner",
                   "Error in calling SUNLinSolSetPreconditioner");
    return(CVLS_SUNLS_FAIL);
  }

  return(CVLS_SUCCESS);
}